

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtl.cpp
# Opt level: O0

bool __thiscall pg::RTLSolver::rtl(RTLSolver *this,bitset *SG,int only_player,int depth)

{
  uint *__first;
  unsigned_long *puVar1;
  undefined1 __first_00 [8];
  bool bVar2;
  uint uVar3;
  size_t sVar4;
  ostream *poVar5;
  long lVar6;
  Error *this_00;
  int iVar7;
  _label_vertex _Var8;
  undefined1 local_340 [4];
  int D_1;
  uint local_32c;
  undefined1 local_328 [4];
  int v_9;
  bitset local_318;
  _label_vertex local_2f8;
  int local_2d8;
  size_t v_8;
  size_t local_2c8;
  size_t v_7;
  size_t sStack_2b8;
  int v_6;
  size_t v_5;
  size_t local_2a0;
  size_t v_4;
  int D;
  uint local_27c;
  undefined1 local_278 [4];
  int v_3;
  undefined1 local_268 [16];
  undefined1 local_258 [24];
  int *curedge;
  int local_220;
  size_t v_2;
  Game *pGStack_210;
  bool leaks;
  int local_208;
  _label_vertex local_200;
  Game *local_1f0;
  int local_1e8;
  _label_vertex local_1e0;
  size_t local_1d0;
  size_t v_1;
  undefined1 local_1c0 [4];
  int i;
  uint local_1ac;
  undefined1 local_1a8 [4];
  int v;
  bitset local_198;
  _label_vertex local_178;
  uint local_168;
  uint local_164;
  int pl;
  int pr;
  size_t top;
  bool new_tangles;
  undefined1 local_148 [8];
  bitset Z;
  bitset R;
  int depth_local;
  int only_player_local;
  bitset *SG_local;
  RTLSolver *this_local;
  char local_51;
  bitset *local_50;
  char local_41;
  bitset *local_40;
  char local_31;
  bitset *local_30;
  char local_21;
  bitset *local_20;
  char local_11;
  bitset *local_10;
  
  bitset::bitset((bitset *)&Z._allocsize,SG);
  sVar4 = Solver::nodecount(&this->super_Solver);
  bitset::bitset((bitset *)local_148,sVar4);
  top._3_1_ = 0;
  _pl = bitset::find_last((bitset *)&Z._allocsize);
LAB_0022c83a:
  do {
    if (_pl == 0xffffffffffffffff) {
      this_local._3_1_ = (bool)(top._3_1_ & 1);
LAB_0022dce1:
      v_8._4_4_ = 1;
      bitset::~bitset((bitset *)local_148);
      bitset::~bitset((bitset *)&Z._allocsize);
      return this_local._3_1_;
    }
    local_164 = Solver::priority(&this->super_Solver,pl);
    local_168 = Solver::priority(&this->super_Solver,pl);
    local_168 = local_168 & 1;
    if ((only_player == -1) || (only_player == local_168)) {
      for (; _pl != 0xffffffffffffffff; _pl = bitset::find_prev((bitset *)&Z._allocsize,_pl)) {
        uVar3 = Solver::priority(&this->super_Solver,pl);
        if ((uVar3 & 1) != (local_164 & 1)) break;
        if (1 < (this->super_Solver).trace) {
          poVar5 = std::operator<<((this->super_Solver).logger,"\x1b[1;37mattracting to \x1b[36m");
          _Var8 = Solver::label_vertex(&this->super_Solver,pl);
          local_198._bitssize = (size_t)_Var8.g;
          local_198._allocsize._0_4_ = _Var8.v;
          local_178.g = (Game *)local_198._bitssize;
          local_178.v = (int)local_198._allocsize;
          poVar5 = operator<<(poVar5,&local_178);
          poVar5 = std::operator<<(poVar5,"\x1b[m for \x1b[1;36m");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_168);
          poVar5 = std::operator<<(poVar5,"\x1b[m");
          poVar5 = std::operator<<(poVar5," (pr: ");
          iVar7 = Solver::priority(&this->super_Solver,pl);
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar7);
          poVar5 = std::operator<<(poVar5,")");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        }
        bitset::operator[](&local_198,(size_t)&this->V);
        bitset::reference::operator=((reference *)&local_198,true);
        bitset::operator[]((bitset *)local_1a8,(size_t)local_148);
        bitset::reference::operator=((reference *)local_1a8,true);
        this->str[_pl] = -1;
        iVar7 = (this->Q).pointer;
        (this->Q).pointer = iVar7 + 1;
        (this->Q).queue[iVar7] = (uint)_pl;
        while ((this->Q).pointer != 0) {
          iVar7 = (this->Q).pointer + -1;
          (this->Q).pointer = iVar7;
          local_1ac = (this->Q).queue[iVar7];
          bitset::operator[]((bitset *)local_1c0,(size_t)&Z._allocsize);
          bitset::reference::operator=((reference *)local_1c0,false);
          attractVertices(this,local_168,local_1ac,(bitset *)&Z._allocsize,(bitset *)local_148,
                          (bitset *)&Z._allocsize,local_164);
          attractTangles(this,local_168,local_1ac,(bitset *)&Z._allocsize,(bitset *)local_148,
                         (bitset *)&Z._allocsize,local_164);
        }
      }
      if (1 < (this->super_Solver).trace) {
        std::operator<<((this->super_Solver).logger,"\x1b[1;33mregion\x1b[m ");
        for (v_1._4_4_ = 0; v_1._4_4_ < depth; v_1._4_4_ = v_1._4_4_ + 1) {
          std::operator<<((this->super_Solver).logger,"*");
        }
        poVar5 = std::operator<<((this->super_Solver).logger,"\x1b[1;36m");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_164);
        std::operator<<(poVar5,"\x1b[m");
        for (local_1d0 = bitset::find_last((bitset *)local_148); local_1d0 != 0xffffffffffffffff;
            local_1d0 = bitset::find_prev((bitset *)local_148,local_1d0)) {
          poVar5 = std::operator<<((this->super_Solver).logger," \x1b[1;38;5;15m");
          _Var8 = Solver::label_vertex(&this->super_Solver,(int)local_1d0);
          local_1f0 = _Var8.g;
          local_1e8 = _Var8.v;
          local_1e0.g = local_1f0;
          local_1e0.v = local_1e8;
          poVar5 = operator<<(poVar5,&local_1e0);
          std::operator<<(poVar5,"\x1b[m");
          if (this->str[local_1d0] != -1) {
            poVar5 = std::operator<<((this->super_Solver).logger,"->");
            _Var8 = Solver::label_vertex(&this->super_Solver,this->str[local_1d0]);
            pGStack_210 = _Var8.g;
            local_208 = _Var8.v;
            local_200.g = pGStack_210;
            local_200.v = local_208;
            operator<<(poVar5,&local_200);
          }
        }
        std::ostream::operator<<((this->super_Solver).logger,std::endl<char,std::char_traits<char>>)
        ;
      }
      v_2._7_1_ = 0;
      if ((only_player != -1) || (_pl != 0xffffffffffffffff)) {
        for (_local_220 = bitset::find_last(&this->V); _local_220 != 0xffffffffffffffff;
            _local_220 = bitset::find_prev(&this->V,_local_220)) {
          uVar3 = Solver::owner(&this->super_Solver,local_220);
          if (uVar3 == local_168) {
            if (this->str[_local_220] == -1) {
              bitset::operator[]((bitset *)&stack0xfffffffffffffdd0,(size_t)&this->W);
              bitset::reference::operator=((reference *)&stack0xfffffffffffffdd0,true);
              bitset::operator[]((bitset *)&curedge,(size_t)local_148);
              bitset::reference::operator=((reference *)&curedge,false);
              iVar7 = (this->Q).pointer;
              (this->Q).pointer = iVar7 + 1;
              (this->Q).queue[iVar7] = (uint)_local_220;
            }
          }
          else {
            for (local_258._16_8_ = Solver::outs(&this->super_Solver,local_220);
                *(int *)local_258._16_8_ != -1; local_258._16_8_ = local_258._16_8_ + 4) {
              bitset::operator[]((bitset *)local_258,(size_t)&Z._allocsize);
              bVar2 = bitset::reference::operator_cast_to_bool((reference *)local_258);
              if (bVar2) {
                bitset::operator[]((bitset *)local_268,(size_t)&this->W);
                bitset::reference::operator=((reference *)local_268,true);
                bitset::operator[]((bitset *)local_278,(size_t)local_148);
                bitset::reference::operator=((reference *)local_278,false);
                iVar7 = (this->Q).pointer;
                (this->Q).pointer = iVar7 + 1;
                (this->Q).queue[iVar7] = (uint)_local_220;
                break;
              }
            }
          }
        }
        v_2._7_1_ = (this->Q).pointer != 0;
        while ((this->Q).pointer != 0) {
          iVar7 = (this->Q).pointer + -1;
          (this->Q).pointer = iVar7;
          local_27c = (this->Q).queue[iVar7];
          bitset::operator[]((bitset *)&D,(size_t)local_148);
          bitset::reference::operator=((reference *)&D,false);
          attractVertices(this,1 - local_168,local_27c,(bitset *)local_148,&this->W,
                          (bitset *)local_148,local_164);
          attractTangles(this,1 - local_168,local_27c,(bitset *)local_148,&this->W,
                         (bitset *)local_148,local_164);
        }
      }
      if ((v_2._7_1_ & 1) == 0) {
        __first = this->pea_vidx;
        lVar6 = Solver::nodecount(&this->super_Solver);
        v_4._7_1_ = 0;
        std::fill<unsigned_int*,char>(__first,__first + lVar6,(char *)((long)&v_4 + 7));
        this->pea_curidx = 1;
        v_4._0_4_ = this->dominions;
        for (local_2a0 = bitset::find_last(&this->V); local_2a0 != 0xffffffffffffffff;
            local_2a0 = bitset::find_prev(&this->V,local_2a0)) {
          bitset::operator[]((bitset *)&v_5,(size_t)local_148);
          bVar2 = bitset::reference::operator_cast_to_bool((reference *)&v_5);
          if (((bVar2 ^ 0xffU) & 1) != 0) {
            this_00 = (Error *)__cxa_allocate_exception(0x40);
            Error::Error(this_00,"logic error",
                         "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/rtl.cpp"
                         ,0x203);
            __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
          }
          bVar2 = extractTangles(this,(int)local_2a0,(bitset *)local_148);
          if (bVar2) {
            top._3_1_ = 1;
          }
        }
        if ((int)v_4 != this->dominions) {
          for (sStack_2b8 = bitset::find_first(&this->S); sStack_2b8 != 0xffffffffffffffff;
              sStack_2b8 = bitset::find_next(&this->S,sStack_2b8)) {
            iVar7 = (this->Q).pointer;
            (this->Q).pointer = iVar7 + 1;
            (this->Q).queue[iVar7] = (uint)sStack_2b8;
          }
          while ((this->Q).pointer != 0) {
            iVar7 = (this->Q).pointer + -1;
            (this->Q).pointer = iVar7;
            v_7._4_4_ = (this->Q).queue[iVar7];
            attractVertices(this,local_168,v_7._4_4_,&this->G,&this->S,&this->G,0x7fffffff);
            attractTangles(this,local_168,v_7._4_4_,&this->G,&this->S,&this->G,0x7fffffff);
          }
          for (local_2c8 = bitset::find_first(&this->S); local_2c8 != 0xffffffffffffffff;
              local_2c8 = bitset::find_next(&this->S,local_2c8)) {
            Solver::solve(&this->super_Solver,(int)local_2c8,local_168,this->str[local_2c8]);
          }
          bitset::operator-=(&this->G,&this->S);
          local_10 = &this->S;
          puVar1 = local_10->_bits;
          sVar4 = bitset::num_blocks(local_10);
          local_11 = '\0';
          std::fill<unsigned_long*,char>(puVar1,puVar1 + sVar4,&local_11);
          local_20 = &this->V;
          puVar1 = local_20->_bits;
          sVar4 = bitset::num_blocks(local_20);
          local_21 = '\0';
          std::fill<unsigned_long*,char>(puVar1,puVar1 + sVar4,&local_21);
          this_local._3_1_ = true;
          goto LAB_0022dce1;
        }
        for (_local_2d8 = bitset::find_last(&this->V); _local_2d8 != 0xffffffffffffffff;
            _local_2d8 = bitset::find_prev(&this->V,_local_2d8)) {
          bitset::operator[]((bitset *)&stack0xfffffffffffffd18,(size_t)local_148);
          bVar2 = bitset::reference::operator_cast_to_bool((reference *)&stack0xfffffffffffffd18);
          if (bVar2) {
            if (1 < (this->super_Solver).trace) {
              poVar5 = std::operator<<((this->super_Solver).logger,
                                       "\x1b[1;37mattracting to top vertex \x1b[36m");
              _Var8 = Solver::label_vertex(&this->super_Solver,local_2d8);
              local_318._bitssize = (size_t)_Var8.g;
              local_318._allocsize._0_4_ = _Var8.v;
              local_2f8.g = (Game *)local_318._bitssize;
              local_2f8.v = (int)local_318._allocsize;
              poVar5 = operator<<(poVar5,&local_2f8);
              poVar5 = std::operator<<(poVar5,"\x1b[m");
              std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            }
            bitset::operator[](&local_318,(size_t)&this->W);
            bitset::reference::operator=((reference *)&local_318,true);
            bitset::operator[]((bitset *)local_328,(size_t)local_148);
            bitset::reference::operator=((reference *)local_328,false);
            iVar7 = (this->Q).pointer;
            (this->Q).pointer = iVar7 + 1;
            (this->Q).queue[iVar7] = (uint)_local_2d8;
            break;
          }
        }
        while ((this->Q).pointer != 0) {
          iVar7 = (this->Q).pointer + -1;
          (this->Q).pointer = iVar7;
          local_32c = (this->Q).queue[iVar7];
          bitset::operator[]((bitset *)local_340,(size_t)local_148);
          bitset::reference::operator=((reference *)local_340,false);
          attractVertices(this,1 - local_168,local_32c,(bitset *)local_148,&this->W,
                          (bitset *)local_148,local_164);
          attractTangles(this,1 - local_168,local_32c,(bitset *)local_148,&this->W,
                         (bitset *)local_148,local_164);
        }
      }
      local_30 = &this->V;
      puVar1 = local_30->_bits;
      sVar4 = bitset::num_blocks(local_30);
      local_31 = '\0';
      std::fill<unsigned_long*,char>(puVar1,puVar1 + sVar4,&local_31);
      local_40 = &this->W;
      puVar1 = local_40->_bits;
      sVar4 = bitset::num_blocks(local_40);
      local_41 = '\0';
      std::fill<unsigned_long*,char>(puVar1,puVar1 + sVar4,&local_41);
      bVar2 = bitset::any((bitset *)local_148);
      if (bVar2) {
        iVar7 = this->dominions;
        bVar2 = rtl(this,(bitset *)local_148,only_player,depth + 1);
        if (bVar2) {
          top._3_1_ = 1;
        }
        if (iVar7 != this->dominions) {
          this_local._3_1_ = true;
          goto LAB_0022dce1;
        }
      }
      __first_00 = local_148;
      local_50 = (bitset *)local_148;
      sVar4 = bitset::num_blocks(local_50);
      local_51 = '\0';
      std::fill<unsigned_long*,char>
                ((unsigned_long *)__first_00,(unsigned_long *)((long)__first_00 + sVar4 * 8),
                 &local_51);
      goto LAB_0022c83a;
    }
    _pl = bitset::find_prev((bitset *)&Z._allocsize,_pl);
  } while( true );
}

Assistant:

bool
RTLSolver::rtl(bitset &SG, int only_player, int depth)
{
    bitset R(SG); // make a local copy of SG
    bitset Z(nodecount());

    bool new_tangles = false;

    auto top = R.find_last();

    while (top != bitset::npos) {
        const int pr = priority(top);
        const int pl = priority(top)&1;

        if (only_player != -1 && only_player != pl) {
            // oh. 
            top = R.find_prev(top);
            continue;
        }
            
        // attract from all heads with priority <pr> that are in <R>
        for (; top != bitset::npos; top = R.find_prev(top)) {
            if ((priority(top)&1) != (pr&1)) break; // otf compress
            // if (priority(top) != pr) break; // disable otf compress

#ifndef NDEBUG
            if (trace >= 2) {
                logger << "\033[1;37mattracting to \033[36m" << label_vertex(top) << "\033[m for \033[1;36m" << pl << "\033[m" << " (pr: " << priority(top) << ")" << std::endl;
            }
#endif

            V[top] = true; // heads
            Z[top] = true; // add to <Z>
            str[top] = -1;
            Q.push(top);

            while (Q.nonempty()) {
                const int v = Q.pop();
                R[v] = false; // remove from <R>
                attractVertices(pl, v, R, Z, R, pr);
                attractTangles(pl, v, R, Z, R, pr);
            }
        }

#ifndef NDEBUG
        if (trace >= 2) {
            // report region
            logger << "\033[1;33mregion\033[m ";
            for (int i=0; i<depth; i++) logger << "*";
            logger << "\033[1;36m" << pr << "\033[m";
            for (auto v = Z.find_last(); v != bitset::npos; v = Z.find_prev(v)) {
                logger << " \033[1;38;5;15m" << label_vertex(v) << "\033[m";
                if (str[v] != -1) logger << "->" << label_vertex(str[v]);
            }
            logger << std::endl;
        }
#endif

        bool leaks = false;

        if (!(only_player == -1 and top == bitset::npos)) { // if not lowest region
            // figure out what are good heads.
            for (auto v = V.find_last(); v != bitset::npos; v = V.find_prev(v)) {
                // check if open
                if (owner(v) == pl) {
                    if (str[v] == -1) {
                        W[v] = true;
                        Z[v] = false;
                        Q.push(v);
                    }
                } else {
                    for (auto curedge = outs(v); *curedge != -1; curedge++) {
                        if (R[*curedge]) {
                            W[v] = true;
                            Z[v] = false;
                            Q.push(v);
                            break;
                        }
                    }
                }
            }

            leaks = Q.nonempty();

            while (Q.nonempty()) {
                const int v = Q.pop();
                Z[v] = false; // remove from <Z>
                attractVertices(1-pl, v, Z, W, Z, pr);
                attractTangles(1-pl, v, Z, W, Z, pr);
            }
        }

        if (!leaks) {
            /**
             * Extract tangles by computing bottom SCCs starting at each top vertex.
             * Note: each bottom SCC must contain a top vertex.
             */

            std::fill(pea_vidx, pea_vidx+nodecount(), '\0');
            pea_curidx = 1;

            const auto D = dominions;
            for (auto v = V.find_last(); v != bitset::npos; v = V.find_prev(v)) {
                if (!Z[v]) LOGIC_ERROR;
                if (extractTangles(v, Z)) new_tangles = true;
            }

            // Extend any dominions that were found.
            // (Any solved vertices are now in <S>.)
            if (D != dominions) {
                for (auto v = S.find_first(); v != bitset::npos; v = S.find_next(v)) Q.push(v);

                while (Q.nonempty()) {
                    const int v = Q.pop();
                    attractVertices(pl, v, G, S, G, INT_MAX);
                    attractTangles(pl, v, G, S, G, INT_MAX);
                }

                for (auto v = S.find_first(); v != bitset::npos; v = S.find_next(v)) {
                    Solver::solve(v, pl, str[v]);
                }

                G -= S; // remove from G
                S.reset();
                V.reset();
                return true; // end tl so that we can restart...
            }

            // now if we want to recursively decompose closed regions,
            // we need to remove some top part of the region.
            // the fact that we attract to multiple tops makes this a bit awkward, though.
            // TODO: a better method might be to simply check all newly learned tangles, and
            // then avoid the top vertices of those new tangles?
            if (RECURSIVE_CLOSED_REGIONS) {
                for (auto v = V.find_last(); v != bitset::npos; v = V.find_prev(v)) {
                    if (Z[v]) {
                        if (trace >= 2) {
                            logger << "\033[1;37mattracting to top vertex \033[36m" << label_vertex(v) << "\033[m" << std::endl;
                        }
                        W[v] = true;
                        Z[v] = false;
                        Q.push(v);
                        break; // only pick one highest-priority vertex to avoid
                    }
                }

                while (Q.nonempty()) {
                    const int v = Q.pop();
                    Z[v] = false; // remove from <Z>
                    attractVertices(1-pl, v, Z, W, Z, pr);
                    attractTangles(1-pl, v, Z, W, Z, pr);
                }
            }
        }

        if (RECURSIVE_CLOSED_REGIONS || leaks) {
            V.reset();
            W.reset();

            if (Z.any()) {
                const auto D = dominions;
                if (rtl(Z, only_player, depth+1)) {
                    new_tangles = true;
                }
                if (D != dominions) return true; // full restart
            }
        } else {
            V.reset();
        }

        Z.reset();
    }

    return new_tangles;
}